

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flt2vrml.c
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  bool_t bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  bfile_t *bfile;
  prf_model_t *model;
  FILE *__s;
  undefined8 *puVar6;
  char *pcVar7;
  size_t __size;
  long lVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar12 [16];
  float tmp [3];
  float local_78;
  float local_74;
  float fStack_70;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  int local_54;
  ulong local_50;
  FILE *local_48;
  prf_model_t *local_40;
  long local_38;
  undefined8 uVar11;
  
  if ((argc == 1) || (3 < argc)) {
    main_cold_4();
  }
  else {
    prf_init();
    bfile = bf_create_r(argv[1]);
    if (bfile == (bfile_t *)0x0) {
      main_cold_3();
    }
    else {
      model = prf_model_create();
      prf_model_poolmem(model);
      bVar2 = prf_model_load(model,bfile);
      bf_destroy(bfile);
      if (bVar2 == 0) {
        main_cold_2();
      }
      else {
        __s = _stdout;
        if ((argc != 3) || (__s = fopen(argv[2],"w"), __s != (FILE *)0x0)) {
          local_54 = argc;
          fwrite("#VRML V1.0 ascii\n",0x11,1,__s);
          fwrite("#[generated by flt2vrml v0.2, ",0x1e,1,__s);
          fwrite("http://www.sim.no]\n",0x13,1,__s);
          fwrite("\nSeparator {\n",0xd,1,__s);
          indexarray = array_create_int(4);
          vertexarray = array_create_float(4);
          colorarray = array_create_int(4);
          texcoordarray = array_create_float(4);
          facesets = array_create_ptr(4);
          currmodel = model;
          materialLookup = bsp_create(3);
          ofversion = *(uint16_t *)(model->header->data + 8);
          local_40 = model;
          prf_model_traverse_io(model,(prf_cb_t)ZEXT816(0x103e84));
          iVar3 = array_count(facesets);
          if (0 < iVar3) {
            lVar8 = 0;
            local_48 = __s;
            do {
              puVar6 = (undefined8 *)facesets[lVar8];
              iVar3 = array_count((void *)puVar6[3]);
              uVar4 = bsp_get_num_points((void *)puVar6[6]);
              array_count((void *)puVar6[4]);
              iVar5 = array_count((void *)puVar6[5]);
              if (*(short *)((long)puVar6 + 0x3c) < 0) {
                if (uVar4 != 0) {
                  local_68 = iVar5;
                  local_64 = iVar3;
                  local_50 = (ulong)uVar4;
                  fwrite("  Separator {\n",0xe,1,__s);
                  goto LAB_0010385d;
                }
              }
              else if (uVar4 != 0) {
                lVar1 = puVar6[8];
                local_68 = iVar5;
                local_64 = iVar3;
                local_50 = (ulong)uVar4;
                fwrite("  Separator {\n",0xe,1,__s);
                if (lVar1 != 0) {
                  fprintf(__s,"  Texture2 {\n    filename \"%s\"\n  }\n",puVar6[8]);
                }
LAB_0010385d:
                uVar4 = *(uint *)(puVar6 + 7);
                auVar12._0_4_ = (float)(uVar4 & 0xff00);
                auVar12._4_4_ = (float)(uVar4 & 0xff0000);
                auVar12._8_8_ = 0;
                auVar12 = divps(auVar12,_DAT_00110060);
                uVar11 = auVar12._0_8_;
                fVar10 = (float)(uVar4 & 0xff) / 255.0;
                local_38 = lVar8;
                if ((*(ushort *)((long)puVar6 + 0x4c) | 2) == 3) {
                  iVar3 = bsp_get_num_points((void *)*puVar6);
                  if (iVar3 < 2) {
                    bsp_get_point((void *)*puVar6,0,&local_78);
                    uVar11 = CONCAT44(fStack_70,local_74);
                    fVar10 = local_78;
                    goto LAB_00103988;
                  }
                  fprintf(__s,"  Material {\n    ambientColor %g %g %g\n    diffuseColor [\n",
                          (double)*(float *)((long)puVar6 + 100),(double)*(float *)(puVar6 + 0xd),
                          (double)*(float *)((long)puVar6 + 0x6c));
                  iVar3 = bsp_get_num_points((void *)*puVar6);
                  if (0 < iVar3) {
                    iVar5 = 0;
                    do {
                      bsp_get_point((void *)*puVar6,iVar5,&local_78);
                      pcVar7 = "      %g %g %g\n";
                      if (iVar5 < iVar3 + -1) {
                        pcVar7 = "      %g %g %g,\n";
                      }
                      fprintf(__s,pcVar7,(double)local_78,(double)local_74,(double)fStack_70);
                      iVar5 = iVar5 + 1;
                    } while (iVar3 != iVar5);
                  }
                  fwrite("    ]\n",6,1,__s);
                  local_6c = 0;
                }
                else {
LAB_00103988:
                  fVar9 = (float)((ulong)uVar11 >> 0x20);
                  iVar3 = fprintf(__s,
                                  "  Material {\n    diffuseColor %g %g %g\n    ambientColor %g %g %g\n"
                                  ,(double)(*(float *)(puVar6 + 0xe) * fVar10),
                                  (double)(*(float *)((long)puVar6 + 0x74) * (float)uVar11),
                                  (double)(*(float *)(puVar6 + 0xf) * fVar9),
                                  (double)(fVar10 * *(float *)((long)puVar6 + 100)),
                                  (double)(*(float *)(puVar6 + 0xd) * (float)uVar11),
                                  (double)(fVar9 * *(float *)((long)puVar6 + 0x6c)));
                  local_6c = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
                }
                fVar9 = 1.0 - ((float)*(ushort *)((long)puVar6 + 0x4a) / -65535.0 + 1.0) *
                              *(float *)(puVar6 + 0x13);
                fVar10 = 0.0;
                if ((0.003921569 <= fVar9) && (fVar10 = fVar9, 1.0 < fVar9)) {
                  fVar10 = 1.0;
                }
                fprintf(__s,
                        "    specularColor %g %g %g\n    emissiveColor %g %g %g\n    shininess %g\n    transparency %g\n  }\n"
                        ,(double)*(float *)((long)puVar6 + 0x7c),(double)*(float *)(puVar6 + 0x10),
                        (double)*(float *)((long)puVar6 + 0x84),(double)*(float *)(puVar6 + 0x11),
                        (double)*(float *)((long)puVar6 + 0x8c),(double)*(float *)(puVar6 + 0x12),
                        (double)(*(float *)((long)puVar6 + 0x94) * 0.0078125),(double)fVar10);
                fwrite("  Coordinate3 {\n    point [\n",0x1c,1,__s);
                iVar3 = (int)local_50;
                local_60 = puVar6;
                if (0 < iVar3) {
                  iVar5 = 0;
                  do {
                    bsp_get_point((void *)local_60[6],iVar5,&local_78);
                    pcVar7 = "      %g %g %g\n";
                    if (iVar5 < iVar3 + -1) {
                      pcVar7 = "      %g %g %g,\n";
                    }
                    fprintf(local_48,pcVar7,(double)local_78,(double)fStack_70,(double)-local_74);
                    iVar5 = iVar5 + 1;
                  } while (iVar3 != iVar5);
                }
                __s = local_48;
                fwrite("    ]\n  }\n",10,1,local_48);
                puVar6 = local_60;
                iVar3 = bsp_get_num_points((void *)local_60[1]);
                if (iVar3 != 0) {
                  fwrite("  TextureCoordinate2 {\n    point [\n",0x23,1,__s);
                  if (0 < iVar3) {
                    iVar5 = 0;
                    do {
                      bsp_get_point((void *)local_60[1],iVar5,&local_78);
                      pcVar7 = "      %g %g\n";
                      if (iVar5 < iVar3 + -1) {
                        pcVar7 = "      %g %g,\n";
                      }
                      fprintf(__s,pcVar7,(double)local_78,(double)local_74);
                      iVar5 = iVar5 + 1;
                    } while (iVar3 != iVar5);
                  }
                  fwrite("    ]\n  }\n",10,1,__s);
                  puVar6 = local_60;
                }
                lVar8 = local_38;
                if (local_64 != 0) {
                  if ((char)local_6c == '\0') {
                    fwrite("  MaterialBinding {\n    value PER_VERTEX_INDEXED\n  }\n",0x35,1,__s);
                    fwrite("  IndexedFaceSet {\n",0x13,1,__s);
                    fwrite("    materialIndex [\n      ",0x1a,1,__s);
                    print_index_array((FILE *)__s,(int *)puVar6[2]);
                    __size = 8;
                    pcVar7 = "    ]\n}\n";
                  }
                  else {
                    __size = 0x13;
                    pcVar7 = "  IndexedFaceSet {\n";
                  }
                  fwrite(pcVar7,__size,1,__s);
                  fwrite("    coordIndex [\n      ",0x17,1,__s);
                  print_index_array((FILE *)__s,(int *)puVar6[3]);
                  fwrite("    ]\n",6,1,__s);
                  if (local_68 != 0) {
                    fwrite("    textureCoordIndex [\n      ",0x1e,1,__s);
                    print_index_array((FILE *)__s,(int *)puVar6[5]);
                    fwrite("    ]\n",6,1,__s);
                  }
                  fwrite("  }\n",4,1,__s);
                }
                fwrite("  }\n",4,1,__s);
              }
              puVar6 = (undefined8 *)facesets[lVar8];
              bsp_destroy((void *)*puVar6);
              bsp_destroy((void *)puVar6[1]);
              bsp_destroy((void *)puVar6[6]);
              array_destroy((void *)puVar6[3]);
              array_destroy((void *)puVar6[4]);
              array_destroy((void *)puVar6[5]);
              array_destroy((void *)puVar6[2]);
              free(puVar6);
              facesets[lVar8] = (void *)0x0;
              lVar8 = lVar8 + 1;
              iVar3 = array_count(facesets);
            } while (lVar8 < iVar3);
          }
          fwrite("}\n",2,1,__s);
          array_destroy(indexarray);
          array_destroy(vertexarray);
          array_destroy(colorarray);
          array_destroy(texcoordarray);
          array_destroy(facesets);
          bsp_destroy(materialLookup);
          if (local_54 == 3) {
            fclose(__s);
          }
          prf_model_destroy(local_40);
          prf_exit();
          return 0;
        }
        main_cold_1();
      }
    }
  }
  return -1;
}

Assistant:

int main(int argc, char ** argv )
{
  bfile_t * modelfile;
  prf_model_t * model;
  FILE * vrml;

  if ( argc == 1 || argc > 3 ) {
    fprintf( stderr, "Usage: %s <flt-file> [<filename.wrl>]\n", argv[0] );
    return -1;
  }

  prf_init();

  modelfile = bf_create_r( argv[1] );
  if ( ! modelfile ) {
    fprintf( stderr, "Error: Couldn't open file named \"%s\".\n", argv[1] );
    prf_exit();
    return -1;
  }

  model = prf_model_create();
  assert( model != NULL );
  prf_model_poolmem( model );

  if ( ! prf_model_load( model, modelfile ) ) {
    bf_destroy( modelfile );
    prf_model_destroy( model );
    prf_exit();
    fprintf( stderr, "Error: Couldn't load Open Flight file \"%s\".\n",
      argv[1] );
    return -1;
  }
  bf_destroy( modelfile );

  if ( argc == 3 ) {
    vrml = fopen( argv[2], "w" );
    if ( ! vrml ) {
      perror( "fopen()" );
      prf_model_destroy( model );
      prf_exit();
      return -1;
    }
  } else {
    vrml = stdout;
  }

  flt2vrml( model, vrml );

  if ( argc == 3 ) fclose( vrml );
  prf_model_destroy( model );
  prf_exit();
  return 0;
}